

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

bool __thiscall
QWidgetTextControlPrivate::dropEvent
          (QWidgetTextControlPrivate *this,QMimeData *mimeData,QPointF *pos,DropAction dropAction,
          QObject *source)

{
  bool bVar1;
  QWidgetTextControl *pQVar2;
  int in_ECX;
  QWidgetTextControl *in_RDX;
  undefined8 in_RSI;
  QWidgetTextControlPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidgetTextControl *q;
  QTextCursor insertionCursor;
  undefined4 in_stack_ffffffffffffff88;
  TextInteractionFlag in_stack_ffffffffffffff8c;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  byte local_59;
  undefined4 in_stack_ffffffffffffffb0;
  bool local_29;
  undefined1 *local_28;
  QFlagsStorageHelper<Qt::TextInteractionFlag,_4> local_1c;
  QTextCursor local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = q_func(in_RDI);
  QTextCursor::QTextCursor(local_18);
  QTextCursor::operator=
            ((QTextCursor *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
             (QTextCursor *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  QTextCursor::~QTextCursor(local_18);
  local_1c.super_QFlagsStorage<Qt::TextInteractionFlag>.i =
       (QFlagsStorage<Qt::TextInteractionFlag>)
       QFlags<Qt::TextInteractionFlag>::operator&
                 ((QFlags<Qt::TextInteractionFlag> *)
                  CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                  in_stack_ffffffffffffff8c);
  bVar1 = QFlags<Qt::TextInteractionFlag>::operator!((QFlags<Qt::TextInteractionFlag> *)&local_1c);
  local_59 = 1;
  if (!bVar1) {
    local_59 = (**(code **)(*(long *)pQVar2 + 0xa0))(pQVar2,in_RSI);
    local_59 = local_59 ^ 0xff;
  }
  if ((local_59 & 1) == 0) {
    repaintSelection((QWidgetTextControlPrivate *)
                     CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    QWidgetTextControl::cursorForPosition
              (in_RDX,(QPointF *)CONCAT44(in_ECX,in_stack_ffffffffffffffb0));
    QTextCursor::beginEditBlock();
    if ((in_ECX == 2) &&
       (bVar1 = ::operator==((QObject **)
                             CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                             (QPointer<QWidget> *)
                             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)), bVar1))
    {
      QTextCursor::removeSelectedText();
    }
    QTextCursor::operator=(&in_RDI->cursor,(QTextCursor *)&local_28);
    (**(code **)(*(long *)pQVar2 + 0xa8))(pQVar2,in_RSI);
    QTextCursor::endEditBlock();
    (**(code **)(*(long *)pQVar2 + 0x60))();
    local_29 = true;
    QTextCursor::~QTextCursor((QTextCursor *)&local_28);
  }
  else {
    local_29 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_29;
}

Assistant:

bool QWidgetTextControlPrivate::dropEvent(const QMimeData *mimeData, const QPointF &pos, Qt::DropAction dropAction, QObject *source)
{
    Q_Q(QWidgetTextControl);
    dndFeedbackCursor = QTextCursor();

    if (!(interactionFlags & Qt::TextEditable) || !q->canInsertFromMimeData(mimeData))
        return false;

    repaintSelection();

    QTextCursor insertionCursor = q->cursorForPosition(pos);
    insertionCursor.beginEditBlock();

    if (dropAction == Qt::MoveAction && source == contextWidget)
        cursor.removeSelectedText();

    cursor = insertionCursor;
    q->insertFromMimeData(mimeData);
    insertionCursor.endEditBlock();
    q->ensureCursorVisible();
    return true; // accept proposed action
}